

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_delete.hpp
# Opt level: O0

void boost::checked_delete<boost::basic_wrap_stringstream<char>>(basic_wrap_stringstream<char> *x)

{
  basic_wrap_stringstream<char> *in_RDI;
  
  if (in_RDI != (basic_wrap_stringstream<char> *)0x0) {
    basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_RDI);
    operator_delete(in_RDI,0x198);
  }
  return;
}

Assistant:

inline void checked_delete(T * x)
{
    // intentionally complex - simplification causes regressions
    typedef char type_must_be_complete[ sizeof(T)? 1: -1 ];
    (void) sizeof(type_must_be_complete);
    delete x;
}